

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

CVmTimeZone * __thiscall
CVmTimeZoneCache::parse_zone_2(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  CVmTimeZone *pCVar2;
  CVmTimeZoneCache *in_RDX;
  char *in_RSI;
  char *in_RDI;
  CVmTimeZone *tz;
  size_t in_stack_00000048;
  char *in_stack_00000050;
  CVmTimeZoneCache *in_stack_00000058;
  int32_t in_stack_000000a4;
  CVmTimeZoneCache *in_stack_000000a8;
  char *str1;
  CVmTimeZoneCache *in_stack_fffffffffffffff8;
  
  str1 = in_RDI;
  iVar1 = lib_stricmp(in_RDI,(size_t)in_RSI,(char *)in_RDX);
  if (((iVar1 == 0) || (iVar1 = lib_stricmp(str1,(size_t)in_RSI,(char *)in_RDX), iVar1 == 0)) ||
     (iVar1 = lib_stricmp(str1,(size_t)in_RSI,(char *)in_RDX), iVar1 == 0)) {
    pCVar2 = get_gmtofs_zone(in_stack_000000a8,in_stack_000000a4);
  }
  else {
    pCVar2 = parse_zone_hhmmss(in_stack_fffffffffffffff8,str1,in_RSI,(size_t)in_RDX);
    if (((pCVar2 == (CVmTimeZone *)0x0) &&
        (pCVar2 = parse_zone_hhmmss(in_stack_fffffffffffffff8,str1,in_RSI,(size_t)in_RDX),
        pCVar2 == (CVmTimeZone *)0x0)) &&
       ((pCVar2 = parse_zone_posixTZ(in_stack_00000058,in_stack_00000050,in_stack_00000048),
        pCVar2 == (CVmTimeZone *)0x0 &&
        (pCVar2 = get_db_zone(in_RDX,(char *)0x0,(size_t)in_RDI), pCVar2 == (CVmTimeZone *)0x0)))) {
      pCVar2 = (CVmTimeZone *)0x0;
    }
  }
  return pCVar2;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone_2(VMG_ const char *name, size_t len)
{
    /* check for special zones: "Z", "UTC", "GMT" all mean UTC+0 */
    if (lib_stricmp(name, len, "z") == 0
        || lib_stricmp(name, len, "utc") == 0
        || lib_stricmp(name, len, "gmt") == 0)
        return get_gmtofs_zone(vmg_ 0);

    /* try +8, -830, +8:30, -8:00:00 */
    CVmTimeZone *tz;
    if ((tz = parse_zone_hhmmss(vmg_ "", name, len)) != 0)
        return tz;
    
    /* try UTC+8, UTC-830, UTC+8:30, UTC-8:00:00 */
    if ((tz = parse_zone_hhmmss(vmg_ "utc", name, len)) != 0)
        return tz;

    /* try parsing as a POSIX-style EST5EDT string */
    if ((tz = parse_zone_posixTZ(vmg_ name, len)) != 0)
        return tz;
    
    /* it's not one of our special formats; look it up in the database */
    if ((tz = G_tzcache->get_db_zone(vmg_ name, len)) != 0)
        return tz;

    /* return failure */
    return 0;
}